

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O3

void __thiscall
TPZCompElH1<pzshape::TPZShapeTetra>::Shape
          (TPZCompElH1<pzshape::TPZShapeTetra> *this,TPZVec<double> *pt,TPZFMatrix<double> *phi,
          TPZFMatrix<double> *dphi)

{
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar1;
  long lVar2;
  long lVar3;
  TPZVec<long> local_c0;
  long alStack_a0 [4];
  TPZVec<int> local_80;
  int aiStack_60 [12];
  
  TPZVec<long>::TPZVec(&local_c0,0);
  local_c0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01878bc8;
  local_c0.fNElements = 4;
  local_c0.fNAlloc = 0;
  alStack_a0[0] = 0;
  alStack_a0[1] = 0;
  alStack_a0[2] = 0;
  alStack_a0[3] = 0;
  local_c0.fStore = alStack_a0;
  TPZVec<int>::TPZVec(&local_80,0);
  local_80._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0195a058;
  local_80.fNElements = 0xb;
  local_80.fNAlloc = 0;
  aiStack_60[0] = 0;
  aiStack_60[1] = 0;
  aiStack_60[2] = 0;
  aiStack_60[3] = 0;
  aiStack_60[4] = 0;
  aiStack_60[5] = 0;
  aiStack_60[6] = 0;
  aiStack_60[7] = 0;
  aiStack_60[8] = 0;
  aiStack_60[9] = 0;
  aiStack_60[10] = 0;
  local_80.fStore = aiStack_60;
  this_00 = TPZCompEl::Reference((TPZCompEl *)this);
  lVar3 = 0;
  do {
    pTVar1 = TPZGeoEl::NodePtr(this_00,(int)lVar3);
    local_c0.fStore[lVar3] = (long)pTVar1->fId;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  lVar3 = 0;
  do {
    lVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,(int)lVar3 + 4);
    local_80.fStore[lVar3] = (uint)*(byte *)(lVar2 + 0x14);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xb);
  pzshape::TPZShapeTetra::Shape(pt,&local_c0,&local_80,phi,dphi);
  if (local_80.fStore != aiStack_60) {
    local_80.fNAlloc = 0;
    local_80._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_80.fStore != (int *)0x0) {
      operator_delete__(local_80.fStore);
    }
  }
  if (local_c0.fStore != alStack_a0) {
    local_c0.fNAlloc = 0;
    local_c0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_c0.fStore != (long *)0x0) {
      operator_delete__(local_c0.fStore);
    }
  }
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
	TPZManVector<int64_t,TSHAPE::NCornerNodes> id(TSHAPE::NCornerNodes,0);
	TPZManVector<int, TSHAPE::NSides-TSHAPE::NCornerNodes+1> ord(TSHAPE::NSides-TSHAPE::NCornerNodes,0);
	int i;
	TPZGeoEl *ref = this->Reference();
	for(i=0; i<TSHAPE::NCornerNodes; i++) {
		id[i] = ref->NodePtr(i)->Id();
	}
	for(i=0; i<TSHAPE::NSides-TSHAPE::NCornerNodes; i++) {
		ord[i] = this->Connect(i+TSHAPE::NCornerNodes).Order();
	}
	TSHAPE::Shape(pt,id,ord,phi,dphi);
}